

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O0

c_float compute_rho_estimate(OSQPWorkspace *work)

{
  c_int l;
  c_int l_00;
  long *in_RDI;
  c_float cVar1;
  c_float cVar2;
  c_float cVar3;
  double dVar4;
  c_float rho_estimate;
  c_float temp_res_norm;
  c_float dua_res_norm;
  c_float pri_res_norm;
  c_float dua_res;
  c_float pri_res;
  c_int m;
  c_int n;
  double local_80;
  double local_78;
  double local_70;
  double local_60;
  double local_58;
  double local_50;
  
  l = *(c_int *)*in_RDI;
  l_00 = *(c_int *)(*in_RDI + 8);
  cVar1 = vec_norm_inf((c_float *)in_RDI[0xb],l_00);
  cVar2 = vec_norm_inf((c_float *)in_RDI[10],l);
  cVar3 = vec_norm_inf((c_float *)in_RDI[8],l_00);
  local_50 = vec_norm_inf((c_float *)in_RDI[0xc],l_00);
  if (local_50 < cVar3) {
    local_50 = cVar3;
  }
  cVar3 = vec_norm_inf(*(c_float **)(*in_RDI + 0x20),l);
  local_58 = vec_norm_inf((c_float *)in_RDI[0xe],l);
  if (local_58 < cVar3) {
    local_58 = cVar3;
  }
  local_60 = vec_norm_inf((c_float *)in_RDI[0xd],l);
  if (local_60 < local_58) {
    local_60 = local_58;
  }
  local_78 = *(double *)in_RDI[0x17];
  dVar4 = sqrt((cVar1 / (local_50 + 1e-10)) / (cVar2 / (local_60 + 1e-10) + 1e-10));
  local_78 = local_78 * dVar4;
  local_70 = local_78;
  if (local_78 <= 1e-06) {
    local_70 = 1e-06;
  }
  if (1000000.0 <= local_70) {
    local_80 = 1000000.0;
  }
  else {
    if (local_78 <= 1e-06) {
      local_78 = 1e-06;
    }
    local_80 = local_78;
  }
  return local_80;
}

Assistant:

c_float compute_rho_estimate(OSQPWorkspace *work) {
  c_int   n, m;                       // Dimensions
  c_float pri_res, dua_res;           // Primal and dual residuals
  c_float pri_res_norm, dua_res_norm; // Normalization for the residuals
  c_float temp_res_norm;              // Temporary residual norm
  c_float rho_estimate;               // Rho estimate value

  // Get problem dimensions
  n = work->data->n;
  m = work->data->m;

  // Get primal and dual residuals
  pri_res = vec_norm_inf(work->z_prev, m);
  dua_res = vec_norm_inf(work->x_prev, n);

  // Normalize primal residual
  pri_res_norm  = vec_norm_inf(work->z, m);           // ||z||
  temp_res_norm = vec_norm_inf(work->Ax, m);          // ||Ax||
  pri_res_norm  = c_max(pri_res_norm, temp_res_norm); // max (||z||,||Ax||)
  pri_res      /= (pri_res_norm + 1e-10);             // Normalize primal
                                                      // residual (prevent 0
                                                      // division)

  // Normalize dual residual
  dua_res_norm  = vec_norm_inf(work->data->q, n);     // ||q||
  temp_res_norm = vec_norm_inf(work->Aty, n);         // ||A' y||
  dua_res_norm  = c_max(dua_res_norm, temp_res_norm);
  temp_res_norm = vec_norm_inf(work->Px, n);          //  ||P x||
  dua_res_norm  = c_max(dua_res_norm, temp_res_norm); // max(||q||,||A' y||,||P
                                                      // x||)
  dua_res      /= (dua_res_norm + 1e-10);             // Normalize dual residual
                                                      // (prevent 0 division)


  // Return rho estimate
  rho_estimate = work->settings->rho * c_sqrt(pri_res / (dua_res + 1e-10)); // (prevent
                                                                            // 0
                                                                            // division)
  rho_estimate = c_min(c_max(rho_estimate, RHO_MIN), RHO_MAX);              // Constrain
                                                                            // rho
                                                                            // values
  return rho_estimate;
}